

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall IR::Instr::CanHaveArgOutChain(Instr *this)

{
  OpCode OVar1;
  bool bVar2;
  
  OVar1 = this->m_opcode;
  bVar2 = true;
  if ((((5 < OVar1 - 0xc4) || ((0x29U >> (OVar1 - 0xc4 & 0x1f) & 1) == 0)) && (OVar1 != CallI)) &&
     ((OVar1 != NewScObjectSpread && (OVar1 != CallIFixed)))) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Instr::CanHaveArgOutChain() const
{
    return
        this->m_opcode == Js::OpCode::CallI ||
        this->m_opcode == Js::OpCode::CallIFixed ||
        this->m_opcode == Js::OpCode::NewScObject ||
        this->m_opcode == Js::OpCode::NewScObjectSpread ||
        this->m_opcode == Js::OpCode::NewScObjArray ||
        this->m_opcode == Js::OpCode::NewScObjArraySpread;
}